

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_write_gather.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  kvtree *pkVar2;
  kvtree *pkVar3;
  undefined8 uStack_50;
  int rank;
  int val_of_one;
  int val_of_three;
  int val_of_two;
  kvtree *send;
  kvtree *recv;
  int ranks;
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  MPI_Comm_rank(&ompi_mpi_comm_world,&rank);
  MPI_Comm_size(&ompi_mpi_comm_world,&ranks);
  if (ranks != 3) {
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n");
    return 1;
  }
  pkVar2 = (kvtree *)kvtree_new();
  send = pkVar2;
  pkVar3 = (kvtree *)kvtree_new();
  recv = pkVar3;
  if (rank == 0) {
    kvtree_util_set_int(pkVar2,"ONE",1);
    kvtree_util_set_int(pkVar2,"TWO",2);
  }
  if (rank == 2) {
    kvtree_util_set_int(pkVar2,"ONE",0xffffffffffffffff);
    kvtree_util_set_int(pkVar2,"THREE",3);
  }
  iVar1 = kvtree_write_gather("PREFIX",pkVar2,&ompi_mpi_comm_world);
  if (iVar1 == 0) {
    iVar1 = kvtree_read_scatter("PREFIX",pkVar3,&ompi_mpi_comm_world);
    if (iVar1 == 0) {
      if (pkVar3 == (kvtree *)0x0) {
        printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
        uStack_50 = 0x31;
      }
      else {
        printf("rank=%d, send\n",(ulong)(uint)rank);
        kvtree_print(pkVar2,4);
        printf("rank=%d, recv\n",(ulong)(uint)rank);
        kvtree_print(pkVar3,4);
        if (rank == 0) {
          iVar1 = kvtree_util_get_int(pkVar3,"ONE",&val_of_one);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' failed");
            uStack_50 = 0x3c;
            goto LAB_0010134d;
          }
          if (val_of_one != 1) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'ONE\' returned wrong value");
            uStack_50 = 0x41;
            goto LAB_0010134d;
          }
          iVar1 = kvtree_util_get_int(pkVar3,"TWO",&val_of_two);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' failed");
            uStack_50 = 0x47;
            goto LAB_0010134d;
          }
          if (val_of_two != 2) {
            printf("test_kvtree_write_gather, rank=0, recv read of \'TWO\' returned wrong value");
            uStack_50 = 0x4c;
            goto LAB_0010134d;
          }
        }
        if (rank == 2) {
          iVar1 = kvtree_util_get_int(pkVar3,"ONE",&val_of_one);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' failed");
            uStack_50 = 0x54;
            goto LAB_0010134d;
          }
          if (val_of_one != -1) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'ONE\' returned wrong value");
            uStack_50 = 0x59;
            goto LAB_0010134d;
          }
          iVar1 = kvtree_util_get_int(pkVar3,"THREE",&val_of_three);
          if (iVar1 != 0) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' failed");
            uStack_50 = 0x5f;
            goto LAB_0010134d;
          }
          if (val_of_three != 3) {
            printf("test_kvtree_write_gather, rank=2, recv read of \'THREE\' returned wrong value");
            uStack_50 = 100;
            goto LAB_0010134d;
          }
        }
        if ((rank == 1) && (iVar1 = kvtree_size(pkVar3), iVar1 != 0)) {
          printf(
                "test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive"
                );
          uStack_50 = 0x6b;
        }
        else {
          kvtree_delete(&send);
          if (send == (kvtree *)0x0) {
            kvtree_delete(&recv);
            if (recv == (kvtree *)0x0) {
              MPI_Finalize();
              return 0;
            }
            printf("deletion of recv failed");
            uStack_50 = 0x78;
          }
          else {
            printf("test_kvtree_write_gather, deletion of kvtree failed");
            uStack_50 = 0x72;
          }
        }
      }
    }
    else {
      printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
      uStack_50 = 0x2c;
    }
  }
  else {
    printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
    uStack_50 = 0x26;
  }
LAB_0010134d:
  printf("Error in line %d, file %s, function %s.\n",uStack_50,
         "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/test/test_kvtree_write_gather.c"
         ,"main");
  return 1;
}

Assistant:

int main(int argc, char** argv){
  kvtree* recv;
  kvtree* send;
  //int rc = TEST_PASS;
  int rank, ranks, kvtree_rc;
  int val_of_one, val_of_two, val_of_three;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_write_gather, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }

  send = kvtree_new();
  recv = kvtree_new();
  if(rank == 0){
    kvtree_util_set_int(send, "ONE", 1);
    kvtree_util_set_int(send, "TWO", 2);
  }
  if(rank == 2){
    kvtree_util_set_int(send, "ONE", -1);
    kvtree_util_set_int(send, "THREE", 3);
  }

  kvtree_rc = kvtree_write_gather("PREFIX", send, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_write_gather operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_rc = kvtree_read_scatter("PREFIX", recv, MPI_COMM_WORLD);
  if (kvtree_rc != KVTREE_SUCCESS){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  if (recv == NULL){
    printf("test_kvtree_write_gather, kvtree_read_scatter operation returned NULL kvtree");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  printf("rank=%d, send\n", rank);
  kvtree_print(send, 4);
  printf("rank=%d, recv\n", rank);
  kvtree_print(recv, 4);
  if(rank == 0){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != 1){
      printf("test_kvtree_write_gather, rank=0, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "TWO", &val_of_two);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_two != 2){
      printf("test_kvtree_write_gather, rank=0, recv read of 'TWO' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank == 2){
    kvtree_rc = kvtree_util_get_int(recv, "ONE", &val_of_one);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_one != -1){
      printf("test_kvtree_write_gather, rank=2, recv read of 'ONE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    kvtree_rc = kvtree_util_get_int(recv, "THREE", &val_of_three);
    if (kvtree_rc != KVTREE_SUCCESS){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' failed");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
    if(val_of_three != 3){
      printf("test_kvtree_write_gather, rank=2, recv read of 'THREE' returned wrong value");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  if(rank ==1){
    if(kvtree_size(recv) != 0){
      printf("test_kvtree_write_gather, rank=1, sending hash of size 0 resulted in non-zero receive");
      printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
      return TEST_FAIL;
    }
  }
  kvtree_delete(&send);
  if (send != NULL){
    printf("test_kvtree_write_gather, deletion of kvtree failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }
  kvtree_delete(&recv);
  if (recv != NULL){
    printf("deletion of recv failed");
    printf ("Error in line %d, file %s, function %s.\n", __LINE__, __FILE__, __func__);
    return TEST_FAIL;
  }

  MPI_Finalize();
  return TEST_PASS;
}